

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void test_writer(string *name)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  json *this;
  ostream *poVar3;
  char *pcVar4;
  allocator local_39;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j;
  string local_30;
  
  __stream = fopen("test_files/tmp.json","r");
  iVar2 = fseek(__stream,0,2);
  if (iVar2 == 0xd) {
    fclose(__stream);
    std::__cxx11::string::string((string *)&local_30,"test_files/tmp.json",&local_39);
    argo::parser::load((parser *)&j,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    this = argo::json::operator[]
                     ((json *)j._M_t.
                              super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>
                              .super__Head_base<0UL,_argo::json_*,_false>._M_head_impl,"one");
    bVar1 = argo::json::operator==(this,1);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)jlog,"PASS: ");
      poVar3 = std::operator<<(poVar3,(string *)name);
      pcVar4 = " value of field one is 1";
    }
    else {
      poVar3 = std::operator<<((ostream *)jlog,"FAIL: ");
      poVar3 = std::operator<<(poVar3,(string *)name);
      pcVar4 = " value of field one is not 1";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j);
    return;
  }
  poVar3 = std::operator<<((ostream *)jlog,"FAIL: ");
  poVar3 = std::operator<<(poVar3,(string *)name);
  poVar3 = std::operator<<(poVar3," writer file length is not 13 : ");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void test_writer(string name)
{
    FILE *f = fopen("test_files/tmp.json", "r");
    if (fseek(f, 0, SEEK_END) != 13)
    {
        jlog << "FAIL: " << name << " writer file length is not 13 : " << endl;
    }
    else
    {
        fclose(f);
        auto j = parser::load("test_files/tmp.json");
        if ((*j)["one"] == 1)
        {
            jlog << "PASS: " << name << " value of field one is 1" << endl;
        }
        else
        {
            jlog << "FAIL: " << name << " value of field one is not 1" << endl;
        }
    }
}